

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnAdminPMessage
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,PlayerInfo *target,
          string_view message)

{
  bool bVar1;
  __sv_type _Var2;
  code *local_c8;
  size_t local_a8;
  char *local_a0;
  size_t local_88;
  char *local_80;
  undefined1 local_68 [8];
  string msg;
  logFuncType func;
  PlayerInfo *target_local;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view message_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x10 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_68,&this->pAdminMsgFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  if (!bVar1) {
    RenX::processTags((string *)local_68,server,player,target,(BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x1508));
    local_88 = _Var2._M_len;
    local_80 = _Var2._M_str;
    RenX::replace_tag(local_68,local_88,local_80,message._M_len,message._M_str);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_c8 = (code *)msg.field_2._8_8_;
    }
    else {
      local_c8 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_a8 = _Var2._M_len;
    local_a0 = _Var2._M_str;
    (*local_c8)(server,local_a8,local_a0);
  }
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnAdminPMessage(RenX::Server &server, const RenX::PlayerInfo &player, const RenX::PlayerInfo &target, std::string_view message)
{
	logFuncType func;
	if (RenX_LoggingPlugin::adminPMessagePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->pAdminMsgFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &target);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, message);
		(server.*func)(msg);
	}
}